

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test1(void)

{
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  int *x;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> v;
  int local_40 [5];
  int local_2c;
  undefined1 local_28 [8];
  Queue q;
  
  CP::queue<int>::queue((queue<int> *)local_28);
  local_2c = 1;
  CP::queue<int>::push((queue<int> *)local_28,&local_2c);
  local_40[0] = 2;
  CP::queue<int>::push((queue<int> *)local_28,local_40);
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _4_4_ = 3;
  CP::queue<int>::push
            ((queue<int> *)local_28,
             (int *)((long)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4));
  CP::queue<int>::to_vector((vector<int,_std::allocator<int>_> *)&__range1,(queue<int> *)local_28,2)
  ;
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)&__range1);
  x = (int *)std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &x);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar3," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range1);
  CP::queue<int>::~queue((queue<int> *)local_28);
  return true;
}

Assistant:

bool test1() {
  Queue q;
  q.push(1);
  q.push(2);
  q.push(3);
  vector<int> v = q.to_vector(2);
  for (auto &x : v) {
    cout << x << " ";
  }
  cout << endl;

  return true;
}